

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

void __thiscall
cfd::core::Address::DecodeAddress
          (Address *this,string *address_string,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters)

{
  pointer *this_00;
  uint8_t uVar1;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *pvVar2;
  bool bVar3;
  uint8_t uVar4;
  int iVar5;
  uint uVar6;
  WitnessVersion WVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  char *addr_family;
  uchar *puVar11;
  size_type sVar12;
  CfdException *pCVar13;
  reference this_01;
  reference pvVar14;
  bool local_4e1;
  allocator local_4b9;
  string local_4b8;
  string local_498;
  NetType_conflict local_474;
  CfdSourceLocation local_470;
  SchnorrPubkey local_458;
  ByteData local_440;
  uchar *local_428;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_420;
  const_iterator local_418;
  undefined1 local_40a;
  allocator local_409;
  string local_408;
  CfdSourceLocation local_3e8;
  AddressFormatData *local_3d0;
  AddressFormatData *local_3c8;
  iterator __end4_1;
  iterator __begin4_1;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *__range4_1;
  AddressFormatData *local_390;
  const_iterator __end4;
  const_iterator __begin4;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *__range4;
  undefined1 local_370 [5];
  bool find_address_type;
  undefined1 local_34a;
  allocator local_349;
  string local_348;
  CfdSourceLocation local_328;
  uchar *local_310;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_308;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_300;
  const_iterator local_2f8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2f0;
  const_iterator local_2e8;
  undefined1 local_2da;
  allocator local_2d9;
  string local_2d8;
  undefined1 local_2b2;
  allocator local_2b1;
  string local_2b0;
  ByteData local_290;
  undefined1 local_278 [8];
  Script script;
  string local_238;
  undefined1 local_212;
  allocator local_211;
  string local_210;
  CfdSourceLocation local_1f0;
  size_t local_1d8;
  size_t written;
  undefined1 local_1c8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data_part;
  string local_190;
  reference local_170;
  AddressFormatData *local_168;
  __normal_iterator<cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
  local_160;
  iterator __end3_1;
  iterator __begin3_1;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *__range3_1;
  byte local_109;
  string local_108;
  byte local_e1;
  string local_e0;
  string local_c0;
  reference local_a0;
  AddressFormatData *param;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *__range3;
  int ret;
  string segwit_prefix;
  string bs58;
  allocator local_21;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *local_20;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *network_parameters_local;
  string *address_string_local;
  Address *this_local;
  
  local_20 = network_parameters;
  network_parameters_local =
       (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
       address_string;
  address_string_local = (string *)this;
  if ((DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
       ::kBech32Separator_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                                   ::kBech32Separator_abi_cxx11_), iVar5 != 0)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)
               &DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                ::kBech32Separator_abi_cxx11_,"1",&local_21);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_21);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                  ::kBech32Separator_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                         ::kBech32Separator_abi_cxx11_);
  }
  ::std::__cxx11::string::string
            ((string *)(segwit_prefix.field_2._M_local_buf + 8),(string *)address_string);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&ret,"",(allocator *)((long)&__range3 + 7));
  ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
  pvVar2 = local_20;
  __range3._0_4_ = 0xffffffff;
  if (local_20 ==
      (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)0x0) {
    GetBitcoinAddressFormatList();
    __end3_1 = ::std::
               vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
               begin((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                      *)&__begin3_1);
    local_160._M_current =
         (AddressFormatData *)
         ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
         ::end((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                *)&__begin3_1);
    while (bVar3 = __gnu_cxx::operator!=(&__end3_1,&local_160), bVar3) {
      local_170 = __gnu_cxx::
                  __normal_iterator<cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
                  ::operator*(&__end3_1);
      AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_190,local_170);
      bVar3 = DecodeAddress::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)
                         &DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                          ::StartsWith,(string *)((long)&segwit_prefix.field_2 + 8),&local_190);
      ::std::__cxx11::string::~string((string *)&local_190);
      if (bVar3) {
        AddressFormatData::GetBech32Hrp_abi_cxx11_
                  ((string *)
                   &data_part.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,local_170);
        this_00 = &data_part.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        ::std::__cxx11::string::operator=((string *)&ret,(string *)this_00);
        ::std::__cxx11::string::~string((string *)this_00);
        AddressFormatData::operator=(&this->format_data_,local_170);
        break;
      }
      __gnu_cxx::
      __normal_iterator<cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
      ::operator++(&__end3_1);
    }
    local_168._4_4_ = 4;
    ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            &__begin3_1);
  }
  else {
    __end3 = ::std::
             vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
             begin(local_20);
    param = (AddressFormatData *)
            ::std::
            vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::end
                      (pvVar2);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
                                       *)&param), bVar3) {
      local_a0 = __gnu_cxx::
                 __normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
                 ::operator*(&__end3);
      local_e1 = 0;
      local_109 = 0;
      AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_c0,local_a0);
      uVar6 = ::std::__cxx11::string::empty();
      local_4e1 = false;
      if ((uVar6 & 1) == 0) {
        AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_e0,local_a0);
        local_e1 = 1;
        uVar9 = ::std::__cxx11::string::length();
        uVar8 = ::std::__cxx11::string::length();
        local_4e1 = false;
        if (uVar9 < uVar8) {
          AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_108,local_a0);
          local_109 = 1;
          local_4e1 = DecodeAddress::anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)
                                 &DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                                  ::StartsWith,(string *)((long)&segwit_prefix.field_2 + 8),
                                 &local_108);
        }
      }
      if ((local_109 & 1) != 0) {
        ::std::__cxx11::string::~string((string *)&local_108);
      }
      if ((local_e1 & 1) != 0) {
        ::std::__cxx11::string::~string((string *)&local_e0);
      }
      ::std::__cxx11::string::~string((string *)&local_c0);
      if (local_4e1 != false) {
        AddressFormatData::GetBech32Hrp_abi_cxx11_((string *)&__range3_1,local_a0);
        ::std::__cxx11::string::operator=((string *)&ret,(string *)&__range3_1);
        ::std::__cxx11::string::~string((string *)&__range3_1);
        AddressFormatData::operator=(&this->format_data_,local_a0);
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
      ::operator++(&__end3);
    }
  }
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&written + 7));
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8,0x80,
             (allocator<unsigned_char> *)((long)&written + 7));
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&written + 7));
  local_1d8 = 0;
  uVar9 = ::std::__cxx11::string::empty();
  if ((uVar9 & 1) == 0) {
    pcVar10 = (char *)::std::__cxx11::string::data();
    addr_family = (char *)::std::__cxx11::string::data();
    puVar11 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
    sVar12 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
    __range3._0_4_ = wally_addr_segwit_to_bytes(pcVar10,addr_family,0,puVar11,sVar12,&local_1d8);
    if ((int)__range3 != 0) {
      local_1f0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_address.cpp"
                   ,0x2f);
      local_1f0.filename = local_1f0.filename + 1;
      local_1f0.line = 0x4c0;
      local_1f0.funcname = "DecodeAddress";
      logger::warn<int&>(&local_1f0,"wally_addr_segwit_to_bytes error. ret={}.",(int *)&__range3);
      if ((int)__range3 != -2) {
        script.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_238,"Segwit-address decode error.",
                   (allocator *)
                   ((long)&script.script_stack_.
                           super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        CfdException::CfdException(pCVar13,kCfdInternalError,&local_238);
        script.script_stack_.
        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
        __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_212 = 1;
      pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_210,"Segwit-address decode error.",&local_211)
      ;
      CfdException::CfdException(pCVar13,kCfdIllegalArgumentError,&local_210);
      local_212 = 0;
      __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8,local_1d8);
    puVar11 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
    ByteData::ByteData(&local_290,puVar11,(uint32_t)local_1d8);
    Script::Script((Script *)local_278,&local_290);
    ByteData::~ByteData(&local_290);
    bVar3 = Script::IsWitnessProgram((Script *)local_278);
    if (!bVar3) {
      local_2b2 = 1;
      pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_2b0,"address decode check error.",&local_2b1);
      CfdException::CfdException(pCVar13,kCfdInternalError,&local_2b0);
      local_2b2 = 0;
      __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
    }
    WVar7 = Script::GetWitnessVersion((Script *)local_278);
    this->witness_ver_ = WVar7;
    if (this->witness_ver_ == kVersion1) {
      if (local_1d8 != 0x22) {
        local_2da = 1;
        pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_2d8,"segwit v1 address decode check error.",&local_2d9);
        CfdException::CfdException(pCVar13,kCfdInternalError,&local_2d8);
        local_2da = 0;
        __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
      }
      SetAddressType(this,kTaprootAddress);
    }
    else if (this->witness_ver_ == kVersion0) {
      if (local_1d8 == 0x16) {
        SetAddressType(this,kP2wpkhAddress);
      }
      else if (local_1d8 == 0x22) {
        SetAddressType(this,kP2wshAddress);
      }
    }
    local_2f0._M_current =
         (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_2e8,&local_2f0);
    local_308._M_current =
         (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
    local_300 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_308,2);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_2f8,&local_300);
    local_310 = (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    local_1c8,local_2e8,local_2f8);
    Script::~Script((Script *)local_278);
  }
  else {
    pcVar10 = (char *)::std::__cxx11::string::data();
    puVar11 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
    sVar12 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
    __range3._0_4_ = wally_base58_to_bytes(pcVar10,1,puVar11,sVar12,&local_1d8);
    if ((int)__range3 != 0) {
      local_328.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_address.cpp"
                   ,0x2f);
      local_328.filename = local_328.filename + 1;
      local_328.line = 0x4e6;
      local_328.funcname = "DecodeAddress";
      logger::warn<int&>(&local_328,"wally_base58_to_bytes error. ret={}.",(int *)&__range3);
      if ((int)__range3 != -2) {
        __range4._6_1_ = 1;
        pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)local_370,"Base58 decode error.",(allocator *)((long)&__range4 + 7));
        CfdException::CfdException(pCVar13,kCfdInternalError,(string *)local_370);
        __range4._6_1_ = 0;
        __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_34a = 1;
      pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_348,"Base58 decode error.",&local_349);
      CfdException::CfdException(pCVar13,kCfdIllegalArgumentError,&local_348);
      local_34a = 0;
      __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8,local_1d8);
    pvVar2 = local_20;
    __range4._5_1_ = 0;
    if (local_20 ==
        (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)0x0)
    {
      GetBitcoinAddressFormatList();
      __end4_1 = ::std::
                 vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 ::begin((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                          *)&__begin4_1);
      local_3c8 = (AddressFormatData *)
                  ::std::
                  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ::end((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                         *)&__begin4_1);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end4_1,
                                (__normal_iterator<cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
                                 *)&local_3c8), bVar3) {
        local_3d0 = __gnu_cxx::
                    __normal_iterator<cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
                    ::operator*(&__end4_1);
        pvVar14 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8,0);
        uVar1 = *pvVar14;
        uVar4 = AddressFormatData::GetP2shPrefix(local_3d0);
        if (uVar1 == uVar4) {
          SetAddressType(this,kP2shAddress);
          __range4._5_1_ = 1;
          AddressFormatData::operator=(&this->format_data_,local_3d0);
          break;
        }
        pvVar14 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8,0);
        uVar1 = *pvVar14;
        uVar4 = AddressFormatData::GetP2pkhPrefix(local_3d0);
        if (uVar1 == uVar4) {
          SetAddressType(this,kP2pkhAddress);
          __range4._5_1_ = 1;
          AddressFormatData::operator=(&this->format_data_,local_3d0);
          break;
        }
        __gnu_cxx::
        __normal_iterator<cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
        ::operator++(&__end4_1);
      }
      local_168._4_4_ = 8;
      ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )&__begin4_1);
    }
    else {
      __end4 = ::std::
               vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
               begin(local_20);
      local_390 = (AddressFormatData *)
                  ::std::
                  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ::end(pvVar2);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
                                         *)&local_390), bVar3) {
        this_01 = __gnu_cxx::
                  __normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
                  ::operator*(&__end4);
        pvVar14 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8,0);
        uVar1 = *pvVar14;
        uVar4 = AddressFormatData::GetP2shPrefix(this_01);
        if (uVar1 == uVar4) {
          SetAddressType(this,kP2shAddress);
          __range4._5_1_ = 1;
          AddressFormatData::operator=(&this->format_data_,this_01);
          break;
        }
        pvVar14 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8,0);
        uVar1 = *pvVar14;
        uVar4 = AddressFormatData::GetP2pkhPrefix(this_01);
        if (uVar1 == uVar4) {
          SetAddressType(this,kP2pkhAddress);
          __range4._5_1_ = 1;
          AddressFormatData::operator=(&this->format_data_,this_01);
          break;
        }
        __gnu_cxx::
        __normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
        ::operator++(&__end4);
      }
    }
    if ((__range4._5_1_ & 1) == 0) {
      local_3e8.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_address.cpp"
                   ,0x2f);
      local_3e8.filename = local_3e8.filename + 1;
      local_3e8.line = 0x50f;
      local_3e8.funcname = "DecodeAddress";
      logger::warn<>(&local_3e8,"Unknown address prefix.");
      local_40a = 1;
      pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_408,"Unknown address prefix.",&local_409);
      CfdException::CfdException(pCVar13,kCfdIllegalArgumentError,&local_408);
      local_40a = 0;
      __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
    }
    this->witness_ver_ = kVersionNone;
    local_420._M_current =
         (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_418,&local_420);
    local_428 = (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    local_1c8,local_418);
  }
  ByteData::ByteData(&local_440,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
  ByteData::operator=(&this->hash_,&local_440);
  ByteData::~ByteData(&local_440);
  if (this->witness_ver_ == kVersion1) {
    SchnorrPubkey::SchnorrPubkey(&local_458,&this->hash_);
    SchnorrPubkey::operator=(&this->schnorr_pubkey_,&local_458);
    SchnorrPubkey::~SchnorrPubkey(&local_458);
  }
  SetNetType(this,&this->format_data_);
  local_470.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_address.cpp"
               ,0x2f);
  local_470.filename = local_470.filename + 1;
  local_470.line = 0x51d;
  local_470.funcname = "DecodeAddress";
  local_474 = AddressFormatData::GetNetType(&this->format_data_);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_4b8,"nettype",&local_4b9);
  AddressFormatData::GetString(&local_498,&this->format_data_,&local_4b8);
  logger::info<cfd::core::NetType,std::__cxx11::string>
            (&local_470,"DecodeAddress nettype={},{}",&local_474,&local_498);
  ::std::__cxx11::string::~string((string *)&local_498);
  ::std::__cxx11::string::~string((string *)&local_4b8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
  ::std::__cxx11::string::~string((string *)&ret);
  ::std::__cxx11::string::~string((string *)(segwit_prefix.field_2._M_local_buf + 8));
  return;
}

Assistant:

void Address::DecodeAddress(
    std::string address_string,
    const std::vector<AddressFormatData>* network_parameters) {
  static const std::string kBech32Separator = "1";
  static const auto StartsWith = [](const std::string& message,
                                    const std::string& bech32_hrp) -> bool {
    return (message.find(bech32_hrp + kBech32Separator) == 0);
  };

  std::string bs58 = address_string;
  std::string segwit_prefix = "";
  int ret = -1;

  if (network_parameters != nullptr) {
    for (const AddressFormatData& param : *network_parameters) {
      // Custom parameter
      if ((!param.GetBech32Hrp().empty()) &&
          (param.GetBech32Hrp().length() < bs58.length()) &&
          (StartsWith(bs58, param.GetBech32Hrp()))) {
        segwit_prefix = param.GetBech32Hrp();
        format_data_ = param;
        break;
      }
    }
  } else {
    for (const auto& param : GetBitcoinAddressFormatList()) {
      if (StartsWith(bs58, param.GetBech32Hrp())) {
        segwit_prefix = param.GetBech32Hrp();
        format_data_ = param;
        break;
      }
    }
  }

  std::vector<uint8_t> data_part(128);
  size_t written = 0;

  if (!segwit_prefix.empty()) {
    // Bech32 Address
    ret = wally_addr_segwit_to_bytes(
        bs58.data(), segwit_prefix.data(), 0, data_part.data(),
        data_part.size(), &written);

    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_addr_segwit_to_bytes error. ret={}.", ret);
      if (ret == WALLY_EINVAL) {
        throw CfdException(
            kCfdIllegalArgumentError, "Segwit-address decode error.");
      } else {
        throw CfdException(kCfdInternalError, "Segwit-address decode error.");
      }
    }

    data_part.resize(written);
    Script script(ByteData(data_part.data(), static_cast<uint32_t>(written)));
    if (!script.IsWitnessProgram()) {
      throw CfdException(kCfdInternalError, "address decode check error.");
    }
    witness_ver_ = script.GetWitnessVersion();

    if (witness_ver_ == kVersion1) {
      if (written != (SchnorrPubkey::kSchnorrPubkeySize + 2)) {
        throw CfdException(
            kCfdInternalError, "segwit v1 address decode check error.");
      }
      SetAddressType(kTaprootAddress);
    } else if (witness_ver_ == kVersion0) {
      if (written == kScriptHashP2wpkhLength) {
        SetAddressType(kP2wpkhAddress);
      } else if (written == kScriptHashP2wshLength) {
        SetAddressType(kP2wshAddress);
      }
    }

    // Delete 0byte:WitnessVersion and 1byte:data_part
    data_part.erase(data_part.begin(), data_part.begin() + 2);

  } else {
    ret = wally_base58_to_bytes(
        bs58.data(), BASE58_FLAG_CHECKSUM, data_part.data(), data_part.size(),
        &written);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_base58_to_bytes error. ret={}.", ret);
      if (ret == WALLY_EINVAL) {
        throw CfdException(kCfdIllegalArgumentError, "Base58 decode error.");
      } else {
        throw CfdException(kCfdInternalError, "Base58 decode error.");
      }
    }

    data_part.resize(written);

    bool find_address_type = false;
    if (network_parameters != nullptr) {
      for (const AddressFormatData& param : *network_parameters) {
        if (data_part[0] == param.GetP2shPrefix()) {
          SetAddressType(kP2shAddress);
          find_address_type = true;
          format_data_ = param;
          break;
        } else if (data_part[0] == param.GetP2pkhPrefix()) {
          SetAddressType(kP2pkhAddress);
          find_address_type = true;
          format_data_ = param;
          break;
        }
      }
    } else {
      for (const auto& param : GetBitcoinAddressFormatList()) {
        if (data_part[0] == param.GetP2shPrefix()) {
          SetAddressType(kP2shAddress);
          find_address_type = true;
          format_data_ = param;
          break;
        } else if (data_part[0] == param.GetP2pkhPrefix()) {
          SetAddressType(kP2pkhAddress);
          find_address_type = true;
          format_data_ = param;
          break;
        }
      }
    }
    if (!find_address_type) {
      warn(CFD_LOG_SOURCE, "Unknown address prefix.");
      throw CfdException(kCfdIllegalArgumentError, "Unknown address prefix.");
    }
    witness_ver_ = kVersionNone;

    // Delete 0byte:prefix.
    data_part.erase(data_part.begin());
  }

  // Setting for Hash.
  hash_ = ByteData(data_part);
  if (witness_ver_ == kVersion1) schnorr_pubkey_ = SchnorrPubkey(hash_);
  SetNetType(format_data_);
  info(
      CFD_LOG_SOURCE, "DecodeAddress nettype={},{}", format_data_.GetNetType(),
      format_data_.GetString(kNettype));
}